

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrecisionTuner.cpp
# Opt level: O0

double __thiscall
PrecisionTuner::__overloading_function
          (PrecisionTuner *this,vector<void_*,_std::allocator<void_*>_> *btVec,string *s,float fres,
          double dres,double value,string *label,double timeStamp)

{
  bool bVar1;
  _Setprecision _Var2;
  void *pvVar3;
  ostream *poVar4;
  string *in_RCX;
  string *in_RDX;
  int *in_RDI;
  float in_XMM0_Da;
  double dVar5;
  double in_XMM1_Qa;
  double dVar6;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  ShadowValue *in_stack_00000058;
  string *in_stack_00000060;
  double relErr_1;
  Profile *in_stack_00000070;
  double relErr;
  ShadowValue shadowValue;
  double res;
  bool singlePrecisionProfiling;
  bool singlePrecision;
  double in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  undefined1 spBoolean;
  double in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  float sp;
  string *in_stack_fffffffffffffec8;
  string local_d0 [32];
  ShadowValue local_b0;
  string local_70 [32];
  double local_50;
  undefined1 local_42;
  byte local_41;
  double local_30;
  double local_28;
  float local_1c;
  
  sp = (float)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  spBoolean = (undefined1)((ulong)in_stack_fffffffffffffeb0 >> 0x38);
  local_30 = (double)CONCAT44(in_XMM2_Db,in_XMM2_Da);
  local_28 = in_XMM1_Qa;
  local_1c = in_XMM0_Da;
  if ((DebugFlag) && (bVar1 = isCurrentDebugType((char *)in_stack_fffffffffffffec8), bVar1)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"STARTING ");
    poVar4 = std::operator<<(poVar4,"__overloading_function");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  local_42 = 0;
  local_41 = 0;
  if (*in_RDI == 0) {
    ShadowValue::ShadowValue
              (&local_b0,(double)in_stack_fffffffffffffec8,sp,in_stack_fffffffffffffeb8,
               (bool)spBoolean,in_stack_fffffffffffffea8);
    in_stack_fffffffffffffec8 = local_d0;
    std::__cxx11::string::string(in_stack_fffffffffffffec8,in_RCX);
    Profile::applyProfiling
              (in_stack_00000070,(vector<void_*,_std::allocator<void_*>_> *)relErr_1,
               in_stack_00000060,in_stack_00000058);
    std::__cxx11::string::~string(local_d0);
  }
  else {
    if (*in_RDI != 1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"PrecisionTuner ERROR: no __mode chosen");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      exit(-1);
    }
    std::__cxx11::string::string(local_70,in_RCX);
    local_41 = Profile::applyStrategy
                         ((Profile *)dres,(vector<void_*,_std::allocator<void_*>_> *)value,label);
    std::__cxx11::string::~string(local_70);
  }
  local_50 = local_28;
  if ((local_41 & 1) != 0) {
    local_50 = (double)local_1c;
  }
  if (((DebugFlag & 1U) != 0) &&
     (bVar1 = isCurrentDebugType((char *)in_stack_fffffffffffffec8), bVar1)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"SINGLE precision? ");
    pvVar3 = (void *)std::ostream::operator<<(poVar4,(bool)(local_41 & 1));
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  if (((DebugFlag & 1U) != 0) &&
     (bVar1 = isCurrentDebugType((char *)in_stack_fffffffffffffec8), bVar1)) {
    _Var2 = std::setprecision(0x10);
    std::operator<<((ostream *)&std::cerr,_Var2);
    dVar5 = (double)local_1c - local_28;
    dVar6 = ABS(local_28);
    if ((local_41 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,in_RDX);
      poVar4 = std::operator<<(poVar4," dres=");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28);
      poVar4 = std::operator<<(poVar4," value=");
      pvVar3 = (void *)std::ostream::operator<<(poVar4,local_30);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,in_RDX);
      poVar4 = std::operator<<(poVar4," dres=");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28);
      poVar4 = std::operator<<(poVar4," fres=");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1c);
      poVar4 = std::operator<<(poVar4," AbsError: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,ABS((double)local_1c - local_28));
      poVar4 = std::operator<<(poVar4," RelError: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,ABS(dVar5) / dVar6);
      poVar4 = std::operator<<(poVar4," value=");
      pvVar3 = (void *)std::ostream::operator<<(poVar4,local_30);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  if (((DebugFlag & 1U) != 0) &&
     (bVar1 = isCurrentDebugType((char *)in_stack_fffffffffffffec8), bVar1)) {
    _Var2 = std::setprecision(0x10);
    std::operator<<((ostream *)&std::cerr,_Var2);
    if ((local_41 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,in_RDX);
      poVar4 = std::operator<<(poVar4," in double precision.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,in_RDX);
      poVar4 = std::operator<<(poVar4," RelError: ");
      pvVar3 = (void *)std::ostream::operator<<
                                 (poVar4,ABS((double)local_1c - local_28) / ABS(local_28));
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  if (((DebugFlag & 1U) != 0) &&
     (bVar1 = isCurrentDebugType((char *)in_stack_fffffffffffffec8), bVar1)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"ENDING ");
    poVar4 = std::operator<<(poVar4,"__overloading_function");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return local_50;
}

Assistant:

double PrecisionTuner::__overloading_function(vector<void*> &btVec, string s,
        float fres, double dres, double value, string label, double timeStamp){
    bool singlePrecision, singlePrecisionProfiling;
    double res;
#ifdef NDEBUG
    UNUSED(s);
    UNUSED(value);
#endif
    DEBUG("info",cerr << "STARTING " << __FUNCTION__ << endl;);
    singlePrecisionProfiling = false;
    singlePrecision = false;
    switch(__mode){
        case APPLYING_STRAT:
            singlePrecision = __profile->applyStrategy(btVec, label);
            break;
        case APPLYING_PROF:
            {
                ShadowValue shadowValue(fres, dres, value, singlePrecisionProfiling, timeStamp);
                __profile->applyProfiling(btVec, label, shadowValue);
            }
            break;
        default:
            {
                cerr << "PrecisionTuner ERROR: no __mode chosen" << endl;
                exit(-1);
            }
            break;
    }
    res = singlePrecision ? (double) fres : dres;
    DEBUG("fperror", cerr << "SINGLE precision? " << singlePrecision << endl; );
    DEBUG("fperrorplus", cerr << std::setprecision(16) ; double relErr = fabs(fres - dres) / fabs(dres); if(singlePrecision)  cerr << s << " dres=" << dres << " fres=" << fres << " AbsError: " << fabs(fres - dres)<<" RelError: " << relErr << " value=" << value <<endl; else cerr << s << " dres=" << dres<< " value=" << value << endl;);
    DEBUG("fperror", cerr << std::setprecision(16) ; double relErr = fabs(fres - dres) / fabs(dres); if(singlePrecision)  cerr << s << " RelError: " << relErr  <<endl; else cerr << s << " in double precision." << endl;);
    DEBUG("info",cerr << "ENDING " << __FUNCTION__ << endl;);
    return res;
}